

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Repeat_Button.H
# Opt level: O0

void __thiscall Fl_Repeat_Button::~Fl_Repeat_Button(Fl_Repeat_Button *this)

{
  Fl_Repeat_Button *this_local;
  
  ~Fl_Repeat_Button(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

class FL_EXPORT Fl_Repeat_Button : public Fl_Button {
  static void repeat_callback(void *);
public:
  int handle(int);
  /**
    Creates a new Fl_Repeat_Button widget using the given
    position, size, and label string. The default boxtype is FL_UP_BOX.
    Deletes the button.
  */
  Fl_Repeat_Button(int X,int Y,int W,int H,const char *l=0);

  void deactivate() {
    Fl::remove_timeout(repeat_callback,this);
    Fl_Button::deactivate();
  }
}